

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void * luaL_testudata(lua_State *L,int ud,char *tname)

{
  int iVar1;
  lua_State *local_30;
  void *p;
  char *tname_local;
  int ud_local;
  lua_State *L_local;
  
  local_30 = (lua_State *)lua_touserdata(L,ud);
  if ((local_30 == (lua_State *)0x0) || (iVar1 = lua_getmetatable(L,ud), iVar1 == 0)) {
    L_local = (lua_State *)0x0;
  }
  else {
    lua_getfield(L,-0xf4628,tname);
    iVar1 = lua_rawequal(L,-1,-2);
    if (iVar1 == 0) {
      local_30 = (lua_State *)0x0;
    }
    lua_settop(L,-3);
    L_local = local_30;
  }
  return L_local;
}

Assistant:

LUALIB_API void *luaL_testudata(lua_State *L, int ud, const char *tname) {
    void *p = lua_touserdata(L, ud);
    if (p != NULL) {  /* value is a userdata? */
        if (lua_getmetatable(L, ud)) {  /* does it have a metatable? */
            luaL_getmetatable(L, tname);  /* get correct metatable */
            if (!lua_rawequal(L, -1, -2))  /* not the same? */
                p = NULL;  /* value is a userdata with wrong metatable */
            lua_pop(L, 2);  /* remove both metatables */
            return p;
        }
    }
    return NULL;  /* value is not a userdata with a metatable */
}